

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.hpp
# Opt level: O1

void __thiscall njoy::ENDFtk::tree::Section::clean(Section *this)

{
  pointer pcVar1;
  size_type sVar2;
  size_type sVar3;
  int iVar4;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  output;
  long lineNumber;
  iterator end;
  iterator position;
  string content;
  TextRecord text;
  int local_bc;
  int local_b8;
  int local_b4;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  long local_a8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  long *local_90;
  long local_88;
  long local_80 [2];
  undefined1 local_70 [64];
  
  pcVar1 = (this->content_)._M_dataplus._M_p;
  sVar2 = (this->content_)._M_string_length;
  if (sVar2 == 0) {
    iVar4 = -1;
  }
  else {
    sVar3 = 0;
    iVar4 = 0;
    do {
      iVar4 = iVar4 + (uint)(pcVar1[sVar3] == '\n');
      sVar3 = sVar3 + 1;
    } while (sVar2 != sVar3);
    iVar4 = iVar4 + -1;
  }
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + (this->content_)._M_string_length);
  local_98._M_current = (char *)local_90;
  local_a0._M_current = (char *)((long)local_90 + local_88);
  local_a8 = 0;
  (this->content_)._M_string_length = 0;
  *(this->content_)._M_dataplus._M_p = '\0';
  local_b0.container = &this->content_;
  if (0 < iVar4) {
    iVar4 = iVar4 + 1;
    do {
      TextRecord::TextRecord<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((TextRecord *)local_70,&local_98,&local_a0,&local_a8,this->mat_,this->mf_,this->mt_
                );
      local_b4 = this->mat_;
      local_b8 = this->mf_;
      local_bc = this->mt_;
      tools::disco::Character<66u>::
      write<std::__cxx11::string,std::back_insert_iterator<std::__cxx11::string>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 &local_b0);
      tools::disco::
      Record<njoy::tools::disco::Integer<4u>,njoy::tools::disco::Integer<2u>,njoy::tools::disco::Integer<3u>,njoy::tools::disco::Column<5u>>
      ::write<std::back_insert_iterator<std::__cxx11::string>,int,int,int>
                (&local_b0,&local_b4,&local_b8,&local_bc);
      if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
        operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
      }
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
  }
  sectionEndRecord((StructureDivision *)local_70,this->mat_,this->mf_);
  StructureDivision::print<std::back_insert_iterator<std::__cxx11::string>>
            ((StructureDivision *)local_70,&local_b0);
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  return;
}

Assistant:

void clean() {

  int NC = this->NC();
  std::string content = this->content();
  auto position = content.begin();
  auto end = content.end();
  long lineNumber = 0;

  this->content_.clear();
  auto output = std::back_inserter( this->content_ );

  while ( NC-- > 0 ) {

    TextRecord text( position, end, lineNumber, this->MAT(), this->MF(), this->MT() );
    text.print( output, this->MAT(), this->MF(), this->MT() );
  }
  SEND( this->MAT(), this->MF() ).print( output );
}